

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O2

void __thiscall MinVR::VRDatumFloat::~VRDatumFloat(VRDatumFloat *this)

{
  VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2>::~VRDatumSpecialized
            ((VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2> *)this);
  operator_delete(this,0x68);
  return;
}

Assistant:

VRDatumFloat(const VRFloat inVal) :
    VRDatumSpecialized<VRFloat, VRCORETYPE_FLOAT>(inVal) {}